

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O2

bool __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
::insert(FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
         *this,shared_ptr<PartialJPDPValuePair> *a,shared_ptr<PartialJPDPValuePair> *overflown_T)

{
  _List_node_base **pp_Var1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  element_type *peVar6;
  sp_counted_base *psVar7;
  bool bVar8;
  const_iterator __position;
  iterator last;
  double dVar9;
  double dVar10;
  shared_count sStack_70;
  _List_node_base *local_68;
  shared_count asStack_60 [2];
  element_type *local_50;
  shared_count local_48;
  _List_node_base *local_40;
  shared_count local_38;
  
  sVar3 = this->_m_capacity;
  sVar4 = (this->_m_l).
          super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
          ._M_impl._M_node._M_size;
  if (sVar4 == sVar3) {
    p_Var5 = (this->_m_l).
             super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_40 = p_Var5[1]._M_next;
    local_38.pi_ = (sp_counted_base *)p_Var5[1]._M_prev;
    if (local_38.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
      UNLOCK();
    }
    peVar6 = a->px;
    local_48.pi_ = (a->pn).pi_;
    if (local_48.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_50 = peVar6;
    dVar9 = (double)(*(code *)local_40->_M_next[1]._M_prev)();
    dVar10 = dVar9;
    (*(peVar6->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[3])(peVar6);
    boost::detail::shared_count::~shared_count(&local_48);
    boost::detail::shared_count::~shared_count(&local_38);
    if (dVar10 <= dVar9) {
      boost::shared_ptr<PartialJPDPValuePair>::operator=(overflown_T,a);
LAB_003ff9b7:
      return sVar4 == sVar3;
    }
    boost::shared_ptr<PartialJPDPValuePair>::operator=
              (overflown_T,(shared_ptr<PartialJPDPValuePair> *)(p_Var5 + 1));
    std::__cxx11::
    list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::pop_back(&this->_m_l);
  }
  bVar8 = true;
  __position._M_node = (_List_node_base *)this;
  do {
    __position._M_node =
         (((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)__position._M_node)->_m_l).
         super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    do {
      if (((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)__position._M_node == this) || (!bVar8)) {
        std::__cxx11::
        list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
        ::insert(&this->_m_l,__position,a);
        goto LAB_003ff9b7;
      }
      local_68 = __position._M_node[1]._M_next;
      asStack_60[0].pi_ = (sp_counted_base *)__position._M_node[1]._M_prev;
      if (__position._M_node[1]._M_prev != (_List_node_base *)0x0) {
        LOCK();
        pp_Var1 = &(__position._M_node[1]._M_prev)->_M_prev;
        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
        UNLOCK();
      }
      peVar6 = a->px;
      sStack_70.pi_ = (a->pn).pi_;
      psVar7 = (a->pn).pi_;
      if (psVar7 != (sp_counted_base *)0x0) {
        LOCK();
        piVar2 = &psVar7->use_count_;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      dVar9 = (double)(*(code *)local_68->_M_next[1]._M_prev)();
      dVar10 = dVar9;
      (*(peVar6->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
        _vptr_PartialPolicyPoolItemInterface[3])();
      boost::detail::shared_count::~shared_count(&sStack_70);
      boost::detail::shared_count::~shared_count(asStack_60);
      bVar8 = dVar10 <= dVar9;
    } while (dVar9 < dVar10);
  } while( true );
}

Assistant:

bool FixedCapacityPriorityQueue<T,_Compare>::insert( T& a, T& overflown_T )
{
    bool overflow = ( _m_l.size() == _m_capacity);
    bool skip_insert = false;

    if(overflow) //check if we need to make space at the end
    {
        // overflown_Tp is the T* to which overflown_Tpp points
        // we set the former to point to the overflown element.
        //T* & overflown_Tp = *overflown_Tpp;

        T& last_in_queue = _m_l.back();
        //std::less< T > theLessOp;
        _Compare theLessOp;
        if( theLessOp( last_in_queue,  a) )
        //if( last_in_queue <  a ) //doesn't work automatically...
        {
            //This does not work with (or need) pointers, 
            //this simply points to last position in queue !!!
            //overflown_Tp = &last_in_queue;             
            
            //rather copy the value of the stuff we will throw out!
            overflown_T = last_in_queue; 
            _m_l.pop_back();
        }
        else
        {
            overflown_T = a;
            skip_insert = true;
        }
    }

    if(!skip_insert)
    {
        //insert a at the appropriate place
        typename std::list<T>::iterator it = _m_l.begin();
        typename std::list<T>::iterator last = _m_l.end();
        bool not_positioned = true; //so long as it does not point to the correct pos.
        //std::less< T > theLessOp;
        _Compare theLessOp;
        while(it != last && not_positioned)
        {
            if( theLessOp( *it, a ) )
                not_positioned = false;
            else
                it++;
        }
        _m_l.insert( it, a);
    }
#if 0 && DEBUG_FCPQ
    std::cout << "----AFTER POP AND INSERT\nthe overflown_Tp=" <<overflown_Tp << ", which means it points to..." <<std::endl ;
    if(overflown_Tp != NULL)
    {
        T& the_overflown_T = (*overflown_Tp);
        std::string typestr = " JPPVValPair* ";
        std::cout << "the_overflown_T [T="<< typestr <<
            "]=" << the_overflown_T << ", which points to..."<<std::endl;

        if(the_overflown_T != NULL)
            std::cout<< (*the_overflown_T).SoftPrintBrief() << std::endl;
        else
            std::cout << "nothing" <<std::endl;
    }
    else
        std::cout << " nothing." << std::endl;
    
    std::cout << "----" <<std::endl ;
#endif
    
    return(overflow);
}